

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O1

bool __thiscall HighsCutGeneration::separateLiftedMixedIntegerCover(HighsCutGeneration *this)

{
  pointer *ppiVar1;
  int iVar2;
  int *piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  pointer piVar4;
  pointer pHVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  pointer piVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  pointer pHVar14;
  pointer __src;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  HighsCDouble *pHVar19;
  HighsCutGeneration *pHVar20;
  size_type __new_size;
  size_type __new_size_00;
  byte bVar21;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  double dVar25;
  undefined8 uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  HighsCDouble HVar34;
  HighsCDouble ulminusetaplusone_1;
  HighsCDouble al;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> m;
  HighsCDouble ulminusetaplusone;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> u;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> a;
  HighsCDouble uih;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  HighsCDouble local_258;
  undefined1 local_248 [16];
  byte local_22a;
  byte local_229;
  undefined1 local_228 [16];
  double local_218;
  undefined8 uStack_210;
  HighsCDouble local_208;
  HighsCutGeneration *local_1f0;
  double local_1e8;
  double local_1e0;
  HighsCDouble local_1d8;
  double local_1c8;
  ulong uStack_1c0;
  undefined1 local_1b8 [16];
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_1a8;
  HighsCDouble local_188;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_178;
  ulong local_160;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_158;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double local_120;
  HighsCDouble local_118;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double local_d8;
  undefined8 uStack_d0;
  long local_c8;
  ulong local_c0;
  double local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  double local_88;
  double local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  this->integralSupport = false;
  this->integralCoefficients = false;
  uVar16 = (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_78,(long)this->rowlen);
  piVar3 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar7 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[*piVar7] = '\x01';
  }
  uVar11 = uVar16 >> 2;
  begin._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  end._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (begin._M_current != end._M_current) {
    uVar8 = (long)end._M_current - (long)begin._M_current >> 2;
    iVar9 = 0;
    if (1 < uVar8) {
      iVar9 = 0;
      do {
        uVar8 = (long)uVar8 >> 1;
        iVar9 = iVar9 + 1;
      } while (1 < uVar8);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0,true>
              (begin,end,(anon_class_8_1_8991fb9c)this,iVar9,true);
  }
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar9 = (int)uVar11;
  __new_size = (size_type)iVar9;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_158,__new_size);
  __new_size_00 = (long)(uVar16 * 0x40000000 + 0x100000000) >> 0x20;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_178,__new_size_00);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_1a8,__new_size_00);
  if (iVar9 == 0) {
    dVar30 = 0.0;
    dVar25 = 0.0;
    dVar31 = 0.0;
    dVar32 = 0.0;
  }
  else {
    dVar32 = 0.0;
    lVar17 = 2;
    lVar18 = 0;
    dVar31 = 0.0;
    dVar25 = 0.0;
    dVar30 = 0.0;
    do {
      iVar2 = *(int *)((long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar17 + -2);
      *(double *)
       ((long)local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start + lVar17 * 4 + -8) = dVar31;
      local_228._0_8_ = dVar32;
      *(double *)
       ((long)&(local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->hi + lVar17 * 4) = dVar32;
      *(double *)
       ((long)local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start + lVar17 * 4 + -8) = dVar30;
      local_248._0_8_ = dVar25;
      *(double *)
       ((long)&(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->hi + lVar17 * 4) = dVar25;
      *(double *)
       ((long)local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start + lVar17 * 4 + -8) = this->vals[iVar2];
      *(undefined8 *)
       ((long)&(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start)->hi + lVar17 * 4) = 0;
      local_1e0 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2];
      local_218 = dVar30;
      local_1c8 = dVar31;
      HVar34 = HighsCDouble::operator*
                         ((HighsCDouble *)
                          ((long)&(local_158.
                                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->hi + lVar18),local_1e0
                         );
      dVar31 = local_1c8 + local_1e0;
      dVar32 = (double)local_228._0_8_ +
               (local_1e0 - (dVar31 - (dVar31 - local_1e0))) + (local_1c8 - (dVar31 - local_1e0));
      dVar25 = HVar34.hi;
      dVar30 = local_218 + dVar25;
      dVar25 = HVar34.lo +
               (double)local_248._0_8_ +
               (local_218 - (dVar30 - dVar25)) + (dVar25 - (dVar30 - (dVar30 - dVar25)));
      lVar17 = lVar17 + 4;
      lVar18 = lVar18 + 0x10;
    } while ((uVar11 & 0xffffffff) << 4 != lVar18);
  }
  local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].hi = dVar31;
  local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].lo = dVar32;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].hi = dVar30;
  local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start[__new_size].lo = dVar25;
  local_1f0 = this;
  if (iVar9 == 0) {
    local_1e8 = 2.12199579047121e-314;
    local_160 = 0xffffffff;
  }
  else {
    bVar22 = true;
    local_160 = 0xffffffff;
    uVar16 = 0;
    local_1e8 = 2.12199579047121e-314;
    local_138 = 0.0;
    do {
      iVar9 = (local_1f0->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16];
      dVar25 = (local_1f0->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar9];
      dVar31 = (local_1f0->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar9];
      dVar30 = local_1f0->feastol;
      dVar32 = dVar25 - dVar30;
      if ((dVar31 < dVar32) || (bVar22)) {
        dVar29 = local_1f0->vals[iVar9];
        dVar33 = dVar25 * dVar29;
        dVar28 = (local_1f0->lambda).hi;
        dVar27 = dVar33 - dVar28;
        dVar28 = ((dVar33 - (dVar28 + dVar27)) + (-dVar28 - (dVar27 - (dVar28 + dVar27)))) -
                 (local_1f0->lambda).lo;
        if ((dVar30 * 10.0 < dVar27 + dVar28) && (dVar30 * 1000.0 <= ABS(dVar29))) {
          local_1b8._8_8_ = 0;
          local_1b8._0_8_ = dVar33;
          local_258.hi = dVar27;
          local_258.lo = dVar28;
          local_218 = dVar25;
          local_1e0 = dVar32;
          local_1c8 = dVar31;
          HighsCDouble::operator/=(&local_258,dVar29);
          local_248._0_8_ = local_258.hi + local_258.lo;
          local_228._0_8_ = this->feastol;
          dVar25 = trunc(local_258.hi + local_258.lo);
          dVar30 = ABS((double)local_248._0_8_ - dVar25);
          dVar25 = 1.0 - dVar30;
          if (dVar30 <= 1.0 - dVar30) {
            dVar25 = dVar30;
          }
          if ((double)local_228._0_8_ < dVar25) {
            dVar25 = ceil((double)local_248._0_8_);
            local_228._8_4_ = extraout_XMM0_Dc;
            local_228._0_8_ = dVar25;
            local_228._12_4_ = extraout_XMM0_Dd;
            dVar30 = local_218 - dVar25;
            local_258.hi = dVar30 + 1.0;
            local_258.lo = (1.0 - (local_258.hi - dVar30)) +
                           (dVar30 - (local_258.hi - (local_258.hi - dVar30))) +
                           (-dVar25 - (dVar30 - local_218)) +
                           (local_218 - (dVar30 - (dVar30 - local_218))) + 0.0;
            HVar34 = HighsCDouble::operator*(&local_258,this->vals[iVar9]);
            piVar4 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
            piVar10 = piVar4;
            if (0 < (long)uVar8) {
              dVar25 = HVar34.hi + HVar34.lo;
              do {
                uVar15 = uVar8 >> 1;
                if (dVar25 < local_1f0->vals[piVar10[uVar15]] ||
                    dVar25 == local_1f0->vals[piVar10[uVar15]]) {
                  piVar10 = piVar10 + uVar15 + 1;
                  uVar15 = ~uVar15 + uVar8;
                }
                uVar8 = uVar15;
              } while (0 < (long)uVar15);
            }
            dVar28 = (double)((ulong)((long)piVar10 - (long)piVar4) >> 2);
            lVar17 = ((long)piVar10 - (long)piVar4) * 0x40000000 >> 0x1c;
            dVar25 = *(double *)
                      ((long)&(local_1a8.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start)->hi + lVar17);
            dVar30 = *(double *)
                      ((long)&(local_1a8.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start)->lo + lVar17);
            dVar29 = dVar25;
            if ((long)uVar16 < (long)SUB84(dVar28,0)) {
              dVar29 = dVar25 - (double)local_1b8._0_8_;
              dVar30 = dVar30 + (dVar25 - ((double)local_1b8._0_8_ + dVar29)) +
                                (-(double)local_1b8._0_8_ -
                                (dVar29 - ((double)local_1b8._0_8_ + dVar29)));
            }
            dVar27 = (double)local_228._0_8_ * local_1f0->vals[iVar9];
            dVar25 = dVar29 + dVar27;
            dVar25 = (dVar27 - (dVar25 - dVar29)) + (dVar29 - (dVar25 - (dVar25 - dVar29))) + dVar30
                     + dVar25;
            if ((local_138 < dVar25) || ((local_1c8 < local_1e0 && (bVar22)))) {
              local_160 = uVar16 & 0xffffffff;
              local_1e8 = dVar28;
              local_138 = dVar25;
              bVar22 = dVar31 >= dVar32;
            }
          }
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uVar11 & 0xffffffff));
  }
  pHVar20 = local_1f0;
  uVar6 = (uint)local_160;
  if (uVar6 != 0xffffffff) {
    iVar9 = (local_1f0->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar6];
    local_1d8.hi = local_1f0->vals[iVar9];
    local_1d8.lo = 0.0;
    local_228._0_8_ =
         (local_1f0->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar9];
    local_228._8_8_ = 0;
    HVar34 = HighsCDouble::operator*(&local_1d8,(double)local_228._0_8_);
    local_218 = HVar34.lo;
    local_248._0_8_ = HVar34.hi;
    local_248._12_4_ = extraout_XMM0_Dd_00;
    local_248._8_4_ = extraout_XMM0_Dc_00;
    dVar25 = (pHVar20->lambda).hi;
    local_1e0 = (double)local_248._0_8_ - dVar25;
    local_1c8 = ((-dVar25 - (local_1e0 - (double)local_248._0_8_)) +
                 ((double)local_248._0_8_ - (local_1e0 - (local_1e0 - (double)local_248._0_8_))) +
                local_218) - (pHVar20->lambda).lo;
    uStack_1c0 = 0x8000000000000000;
    iVar9 = SUB84(local_1e8,0);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_158,(long)iVar9);
    std::vector<int,_std::allocator<int>_>::resize(&pHVar20->cover,(long)iVar9);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_178,(long)(iVar9 + 1));
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_1a8,(long)(iVar9 + 1));
    if ((int)uVar6 < iVar9) {
      pHVar14 = local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + (long)(int)uVar6 + 1;
      if (pHVar14 !=
          local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + (int)uVar6,pHVar14,
                (long)local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pHVar14);
      }
      local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      piVar4 = (pHVar20->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (pHVar20->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      __src = piVar4 + (long)(int)uVar6 + 1;
      dVar25 = (double)local_248._0_8_;
      if (__src != piVar10) {
        memmove(piVar4 + (int)uVar6,__src,(long)piVar10 - (long)__src);
        dVar25 = (double)local_248._0_8_;
      }
      ppiVar1 = &(pHVar20->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      pHVar14 = local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + (long)(int)uVar6 + 2;
      if (pHVar14 !=
          local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove(local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + (long)(int)uVar6 + 1,pHVar14,
                (long)local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pHVar14);
        dVar25 = (double)local_248._0_8_;
      }
      local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      pHVar14 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + (long)(int)uVar6 + 2;
      if (pHVar14 !=
          local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start + (long)(int)uVar6 + 1,pHVar14,
                (long)local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pHVar14);
        dVar25 = (double)local_248._0_8_;
      }
      local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      if ((int)(uVar6 + 1) < iVar9) {
        uVar16 = (long)(int)(uVar6 + 1) << 4 | 8;
        iVar9 = ~uVar6 + iVar9;
        do {
          dVar31 = *(double *)
                    ((long)local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                           ._M_impl.super__Vector_impl_data._M_start + (uVar16 - 8));
          dVar30 = dVar31 - (double)local_228._0_8_;
          *(double *)
           ((long)local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar16 - 8)) = dVar30;
          *(double *)
           ((long)&(local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start)->hi + uVar16) =
               (dVar31 - ((double)local_228._0_8_ + dVar30)) +
               (-(double)local_228._0_8_ - (dVar30 - ((double)local_228._0_8_ + dVar30))) +
               *(double *)
                ((long)&(local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                         _M_impl.super__Vector_impl_data._M_start)->hi + uVar16);
          dVar31 = *(double *)
                    ((long)local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                           ._M_impl.super__Vector_impl_data._M_start + (uVar16 - 8));
          dVar30 = dVar31 - dVar25;
          *(double *)
           ((long)local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar16 - 8)) = dVar30;
          *(double *)
           ((long)&(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start)->hi + uVar16) =
               ((dVar31 - (dVar25 + dVar30)) + (-dVar25 - (dVar30 - (dVar25 + dVar30))) +
               *(double *)
                ((long)&(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                         _M_impl.super__Vector_impl_data._M_start)->hi + uVar16)) - local_218;
          uVar16 = uVar16 + 0x10;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
    }
    uVar16 = (long)local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                   .super__Vector_impl_data._M_start;
    local_258.hi = local_1e0;
    local_258.lo = local_1c8;
    HighsCDouble::operator/=(&local_258,&local_1d8);
    local_218 = local_258.hi + local_258.lo;
    dVar25 = ceil(local_218);
    local_248._8_4_ = extraout_XMM0_Dc_01;
    local_248._0_8_ = dVar25;
    local_248._12_4_ = extraout_XMM0_Dd_01;
    dVar25 = floor(local_218);
    local_258.hi = local_1d8.hi;
    local_258.lo = local_1d8.lo;
    HVar34 = HighsCDouble::operator*(&local_258,dVar25);
    local_208.hi = local_1e0 - HVar34.hi;
    local_208.lo = (local_1c8 +
                   (-HVar34.hi - (local_208.hi - local_1e0)) +
                   (local_1e0 - (local_208.hi - (local_208.hi - local_1e0)))) - HVar34.lo;
    if (local_208.lo + local_208.hi < 0.0) {
      local_208.hi = 0.0;
      local_208.lo = 0.0;
    }
    uStack_1c0 = local_248._8_8_ ^ 0x8000000000000000;
    local_218 = (double)local_228._0_8_ - (double)local_248._0_8_;
    local_1c8 = (-(double)local_248._0_8_ - (local_218 - (double)local_228._0_8_)) +
                ((double)local_228._0_8_ - (local_218 - (local_218 - (double)local_228._0_8_))) +
                0.0;
    local_188.hi = local_218 + 1.0;
    uStack_210 = local_228._8_8_;
    local_188.lo = (1.0 - (local_188.hi - local_218)) +
                   (local_218 - (local_188.hi - (local_188.hi - local_218))) + local_1c8;
    HVar34 = HighsCDouble::operator*(&local_188,local_1d8.hi);
    local_1e0 = HVar34.lo;
    local_1b8._0_8_ = HVar34.hi;
    local_138 = local_188.hi * local_1d8.lo;
    dVar25 = floor(((double)local_248._0_8_ - (double)local_228._0_8_) + -0.5);
    local_228._0_8_ = dVar25;
    dVar25 = floor(local_218 + 0.5);
    local_248._0_8_ = dVar25;
    local_258.hi = local_218;
    local_258.lo = local_1c8;
    HVar34 = HighsCDouble::operator*(&local_258,local_208.hi);
    dVar30 = local_258.hi * local_208.lo;
    dVar32 = HVar34.hi + dVar30;
    dVar25 = (pHVar20->lambda).hi;
    dVar29 = dVar32 - dVar25;
    dVar31 = (pHVar20->lambda).lo;
    (pHVar20->rhs).hi = dVar29;
    (pHVar20->rhs).lo =
         ((-dVar25 - (dVar29 - dVar32)) + (dVar32 - (dVar29 - (dVar29 - dVar32))) +
         HVar34.lo + (HVar34.hi - (dVar32 - dVar30)) + (dVar30 - (dVar32 - (dVar32 - dVar30)))) -
         dVar31;
    pHVar20->integralSupport = true;
    pHVar20->integralCoefficients = false;
    if (pHVar20->rowlen != 0) {
      local_c0 = uVar16 >> 4;
      dVar25 = (double)local_1b8._0_8_ + local_138;
      lVar17 = (long)(double)local_248._0_8_;
      local_1e0 = local_1e0 +
                  ((double)local_1b8._0_8_ - (dVar25 - local_138)) +
                  (local_138 - (dVar25 - (dVar25 - local_138)));
      local_a8 = (long)(int)(double)local_228._0_8_;
      local_b8 = (double)(int)(double)local_228._0_8_;
      uVar6 = (uint)local_c0;
      local_22a = 0 < (int)uVar6;
      uStack_130 = 0;
      local_48._8_4_ = DAT_003c50b0._8_4_;
      local_48._0_8_ = (ulong)DAT_003c50b0 ^ (ulong)dVar25;
      local_48._12_4_ = DAT_003c50b0._12_4_;
      local_98 = (ulong)(uVar6 & 0x7fffffff);
      local_c8 = (long)(int)uVar6;
      local_a0 = local_98 + (local_98 == 0);
      uVar16 = 0;
      local_138 = dVar25;
      do {
        lVar18 = local_a8;
        dVar25 = pHVar20->vals[uVar16];
        uVar23 = 0;
        uVar24 = 0;
        if ((dVar25 != 0.0) || (NAN(dVar25))) {
          local_228._8_8_ = 0;
          local_228._0_8_ = dVar25;
          if ((pHVar20->isintegral).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16] == '\0') {
            if (0.0 <= dVar25) {
              pHVar20->vals[uVar16] = 0.0;
            }
            else {
              pHVar20->integralSupport = false;
            }
          }
          else if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16] == '\0') {
            bVar21 = local_22a;
            local_b0 = uVar16;
            if (0 < (int)local_c0) {
              bVar21 = true;
              uVar16 = 0;
              do {
                uVar6 = (uint)(pHVar20->upper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start
                              [(pHVar20->cover).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar16]];
                uVar13 = uVar6 >> 0x1f;
                local_d8 = (double)CONCAT44(local_d8._4_4_,uVar6);
                local_229 = bVar21;
                local_90 = uVar16;
                if (-1 < (int)uVar6) {
                  iVar9 = 0;
                  do {
                    pHVar14 = local_1a8.
                              super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    local_1b8._8_4_ = uVar23;
                    local_1b8._0_8_ = dVar25;
                    local_1b8._12_4_ = uVar24;
                    local_248._0_8_ = (double)iVar9;
                    HVar34 = HighsCDouble::operator*
                                       (local_158.
                                        super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar16,
                                        (double)iVar9);
                    uVar26 = local_248._8_8_;
                    dVar25 = pHVar14[uVar16].hi;
                    local_248._12_4_ = extraout_XMM0_Dd_02;
                    local_248._8_4_ = extraout_XMM0_Dc_02;
                    dVar30 = HVar34.hi + dVar25;
                    local_1e8 = HVar34.lo +
                                (HVar34.hi - (dVar30 - dVar25)) +
                                (dVar25 - (dVar30 - (dVar30 - dVar25))) + pHVar14[uVar16].lo;
                    dVar25 = local_178.
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar16].hi;
                    local_118.hi = dVar25 + (double)local_248._0_8_;
                    local_118.lo = ((double)local_248._0_8_ - (local_118.hi - dVar25)) +
                                   (dVar25 - (local_118.hi - (local_118.hi - dVar25))) +
                                   local_178.
                                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar16].lo;
                    dVar25 = dVar30 + local_158.
                                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar16].hi;
                    dVar31 = dVar25 - local_138;
                    dVar25 = (((double)local_48._0_8_ - (dVar31 - dVar25)) +
                              (dVar25 - (dVar31 - (dVar31 - dVar25))) +
                             (local_158.
                              super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar16].hi -
                             (dVar25 - dVar30)) + (dVar30 - (dVar25 - (dVar25 - dVar30))) +
                             local_1e8 +
                             local_158.
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar16].lo) - local_1e0;
                    if ((double)local_228._0_8_ <= dVar31 + dVar25) {
                      local_248._8_8_ = uVar26;
                      HVar34 = HighsCDouble::operator*(&local_118,local_188.hi);
                      dVar25 = local_118.hi * local_188.lo;
                      local_258.hi = HVar34.hi + dVar25;
                      local_258.lo = HVar34.lo +
                                     (HVar34.hi - (local_258.hi - dVar25)) +
                                     (dVar25 - (local_258.hi - (local_258.hi - dVar25)));
                      uVar26 = 0;
                      local_218 = local_208.lo;
                      local_248._0_8_ = local_1d8.lo;
                      local_1b8._0_8_ = local_1d8.hi;
                      local_1c8 = local_208.hi;
                      uStack_1c0 = 0;
                      local_1e8 = local_1d8.hi - local_208.hi;
                      HVar34 = HighsCDouble::operator*(&local_258,local_1e8);
                      dVar25 = HVar34.lo;
                      uVar23 = HVar34.hi._0_4_;
                      uVar24 = HVar34.hi._4_4_;
LAB_00282806:
                      dVar30 = (((double)local_248._0_8_ +
                                ((double)local_1b8._0_8_ -
                                (local_1e8 - (local_1e8 - (double)local_1b8._0_8_))) +
                                (-local_1c8 - (local_1e8 - (double)local_1b8._0_8_))) - local_218) *
                               local_258.hi;
                      dVar31 = (double)CONCAT44(uVar24,uVar23) + dVar30;
                      dVar25 = dVar25 + ((double)CONCAT44(uVar24,uVar23) - (dVar31 - dVar30)) +
                                        (dVar30 - (dVar31 - (dVar31 - dVar30)));
                      uVar23 = (undefined4)uVar26;
                      uVar24 = (undefined4)((ulong)uVar26 >> 0x20);
                    }
                    else {
                      local_258.hi = (double)local_228._0_8_ - dVar31;
                      local_248._0_8_ = dVar31;
                      local_258.lo = (((double)local_228._0_8_ - (dVar31 + local_258.hi)) +
                                     (-dVar31 - (local_258.hi - (dVar31 + local_258.hi)))) - dVar25;
                      local_218 = dVar25;
                      local_e8 = dVar30;
                      HighsCDouble::operator/=(&local_258,&local_1d8);
                      lVar18 = (long)(local_258.hi + local_258.lo);
                      do {
                        lVar12 = lVar18 + -1;
                        bVar22 = lVar17 < lVar12;
                        if (lVar17 < lVar12) {
                          dVar25 = local_1b8._0_8_;
                          uVar23 = local_1b8._8_4_;
                          uVar24 = local_1b8._12_4_;
                          goto LAB_00282885;
                        }
                        local_1c8 = (double)lVar12;
                        HVar34 = HighsCDouble::operator*(&local_1d8,local_1c8);
                        dVar25 = (double)local_248._0_8_ + HVar34.hi;
                        dVar31 = dVar25 + local_208.hi;
                        if ((double)local_228._0_8_ <=
                            (local_208.hi - (dVar31 - dVar25)) +
                            (dVar25 - (dVar31 - (dVar31 - dVar25))) +
                            HVar34.lo +
                            (HVar34.hi - (dVar25 - (double)local_248._0_8_)) +
                            ((double)local_248._0_8_ - (dVar25 - (dVar25 - (double)local_248._0_8_))
                            ) + local_218 + local_208.lo + dVar31) {
                          HVar34 = HighsCDouble::operator*(&local_118,local_188.hi);
                          dVar31 = local_118.hi * local_188.lo;
                          dVar25 = HVar34.hi + dVar31;
                          local_258.hi = dVar25 + local_1c8;
                          local_258.lo = (local_1c8 - (local_258.hi - dVar25)) +
                                         (dVar25 - (local_258.hi - (local_258.hi - dVar25))) +
                                         HVar34.lo +
                                         (HVar34.hi - (dVar25 - dVar31)) +
                                         (dVar31 - (dVar25 - (dVar25 - dVar31)));
                          uVar26 = 0;
                          local_218 = local_208.lo;
                          local_248._0_8_ = local_1d8.lo;
                          local_1b8._0_8_ = local_1d8.hi;
                          local_1c8 = local_208.hi;
                          uStack_1c0 = 0;
                          local_1e8 = local_1d8.hi - local_208.hi;
                          HVar34 = HighsCDouble::operator*(&local_258,local_1e8);
                          dVar25 = HVar34.lo;
                          uVar23 = HVar34.hi._0_4_;
                          uVar24 = HVar34.hi._4_4_;
                          goto LAB_00282806;
                        }
                        local_1c8 = (double)lVar18;
                        HVar34 = HighsCDouble::operator*(&local_1d8,local_1c8);
                        dVar25 = (double)local_248._0_8_ + HVar34.hi;
                        lVar18 = lVar18 + 1;
                      } while (HVar34.lo +
                               (HVar34.hi - (dVar25 - (double)local_248._0_8_)) +
                               ((double)local_248._0_8_ -
                               (dVar25 - (dVar25 - (double)local_248._0_8_))) + local_218 + dVar25 <
                               (double)local_228._0_8_);
                      HVar34 = HighsCDouble::operator*(&local_118,local_188.hi);
                      dVar25 = local_118.hi * local_188.lo;
                      local_258.hi = HVar34.hi + dVar25;
                      local_258.lo = HVar34.lo +
                                     (HVar34.hi - (local_258.hi - dVar25)) +
                                     (dVar25 - (local_258.hi - (local_258.hi - dVar25)));
                      local_120 = local_208.lo;
                      local_248._8_8_ = 0;
                      local_248._0_8_ = local_1d8.lo;
                      local_108 = local_1d8.hi;
                      local_f8 = local_208.hi;
                      uStack_f0 = 0;
                      local_128 = local_1d8.hi - local_208.hi;
                      HVar34 = HighsCDouble::operator*(&local_258,local_128);
                      local_218 = HVar34.lo;
                      local_1b8._8_4_ = extraout_XMM0_Dc_03;
                      local_1b8._0_8_ = HVar34.hi;
                      local_1b8._12_4_ = extraout_XMM0_Dd_03;
                      local_88 = local_258.hi;
                      local_58 = local_158.
                                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar16].hi;
                      uStack_50 = 0;
                      local_80 = local_158.
                                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar16].lo;
                      HVar34 = HighsCDouble::operator*(&local_208,local_1c8);
                      dVar27 = (((double)local_248._0_8_ +
                                (local_108 - (local_128 - (local_128 - local_108))) +
                                (-local_f8 - (local_128 - local_108))) - local_120) * local_88;
                      dVar29 = (double)local_1b8._0_8_ + dVar27;
                      dVar30 = (double)local_228._0_8_ + dVar29;
                      dVar32 = dVar30 - local_e8;
                      dVar28 = dVar32 - local_58;
                      dVar25 = local_138 + dVar28;
                      dVar31 = dVar25 - HVar34.hi;
                      uVar23 = (undefined4)uStack_130;
                      uVar24 = (undefined4)((ulong)uStack_130 >> 0x20);
                      dVar25 = (((dVar31 - dVar25) - dVar31) + dVar25 +
                                (-HVar34.hi - (dVar31 - dVar25)) +
                               ((((((dVar32 - dVar30) - dVar32) + dVar30 +
                                   (-local_e8 - (dVar32 - dVar30)) +
                                  (dVar29 - (dVar30 - (dVar30 - dVar29))) +
                                  ((double)local_228._0_8_ - (dVar30 - dVar29)) +
                                  local_218 +
                                  (dVar27 - (dVar29 - (dVar29 - dVar27))) +
                                  ((double)local_1b8._0_8_ - (dVar29 - dVar27))) - local_1e8) +
                                ((dVar28 - dVar32) - dVar28) + dVar32 +
                                (-local_58 - (dVar28 - dVar32))) - local_80) +
                               ((dVar25 - dVar28) - dVar25) + dVar28 +
                               (local_138 - (dVar25 - dVar28)) + local_1e0) - HVar34.lo;
                    }
                    dVar25 = dVar25 + dVar31;
                    bVar22 = false;
LAB_00282885:
                    if (!bVar22) break;
                    bVar22 = iVar9 != local_d8._0_4_;
                    uVar13 = (uint)(local_d8._0_4_ <= iVar9);
                    iVar9 = iVar9 + 1;
                  } while (bVar22);
                }
                pHVar20 = local_1f0;
                bVar21 = local_229;
                if (uVar13 == 0) break;
                uVar16 = local_90 + 1;
                bVar21 = uVar16 < local_98;
              } while (uVar16 != local_a0);
            }
            lVar18 = local_c8;
            if ((bVar21 & 1) == 0) {
              dVar25 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_start[local_c8].hi;
              local_258.hi = (double)local_228._0_8_ - dVar25;
              local_258.lo = (((double)local_228._0_8_ - (dVar25 + local_258.hi)) +
                             (-dVar25 - (local_258.hi - (dVar25 + local_258.hi)))) -
                             local_1a8.
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_start[local_c8].lo;
              HighsCDouble::operator/=(&local_258,&local_1d8);
              lVar12 = (long)(local_258.hi + local_258.lo);
              do {
                pHVar14 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                local_248._0_8_ = (double)(lVar12 + -1);
                HVar34 = HighsCDouble::operator*(&local_1d8,(double)(lVar12 + -1));
                pHVar5 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                dVar25 = pHVar14[lVar18].hi;
                dVar30 = HVar34.hi + dVar25;
                dVar31 = dVar30 + local_208.hi;
                if ((double)local_228._0_8_ <=
                    (local_208.hi - (dVar31 - dVar30)) + (dVar30 - (dVar31 - (dVar31 - dVar30))) +
                    HVar34.lo +
                    (HVar34.hi - (dVar30 - dVar25)) + (dVar25 - (dVar30 - (dVar30 - dVar25))) +
                    pHVar14[lVar18].lo + local_208.lo + dVar31) {
                  pHVar19 = local_178.
                            super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar18;
                  HVar34 = HighsCDouble::operator*(pHVar19,local_188.hi);
                  dVar31 = pHVar19->hi * local_188.lo;
                  dVar25 = HVar34.hi + dVar31;
                  local_258.hi = dVar25 + (double)local_248._0_8_;
                  local_258.lo = ((double)local_248._0_8_ - (local_258.hi - dVar25)) +
                                 (dVar25 - (local_258.hi - (local_258.hi - dVar25))) +
                                 HVar34.lo +
                                 (HVar34.hi - (dVar25 - dVar31)) +
                                 (dVar31 - (dVar25 - (dVar25 - dVar31)));
                  local_248._0_8_ = local_208.lo;
                  local_228._0_8_ = local_1d8.lo;
                  local_1c8 = local_1d8.hi;
                  local_218 = local_208.hi;
                  uStack_210 = 0;
                  local_1b8._0_8_ = local_1d8.hi - local_208.hi;
                  HVar34 = HighsCDouble::operator*(&local_258,local_1d8.hi - local_208.hi);
                  dVar31 = (((double)local_228._0_8_ +
                            (local_1c8 -
                            ((double)local_1b8._0_8_ - ((double)local_1b8._0_8_ - local_1c8))) +
                            (-local_218 - ((double)local_1b8._0_8_ - local_1c8))) -
                           (double)local_248._0_8_) * local_258.hi;
                  dVar25 = HVar34.hi + dVar31;
                  dVar25 = HVar34.lo +
                           (HVar34.hi - (dVar25 - dVar31)) + (dVar31 - (dVar25 - (dVar25 - dVar31)))
                           + dVar25;
                  pHVar20 = local_1f0;
                  goto LAB_00282f13;
                }
                local_248._0_8_ = (double)lVar12;
                HVar34 = HighsCDouble::operator*(&local_1d8,(double)lVar12);
                dVar25 = pHVar5[lVar18].hi;
                dVar31 = HVar34.hi + dVar25;
                lVar12 = lVar12 + 1;
              } while (HVar34.lo +
                       (HVar34.hi - (dVar31 - dVar25)) + (dVar25 - (dVar31 - (dVar31 - dVar25))) +
                       pHVar5[lVar18].lo + dVar31 < (double)local_228._0_8_);
              pHVar19 = local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar18;
              HVar34 = HighsCDouble::operator*(pHVar19,local_188.hi);
              dVar25 = pHVar19->hi * local_188.lo;
              local_258.hi = HVar34.hi + dVar25;
              local_258.lo = HVar34.lo +
                             (HVar34.hi - (local_258.hi - dVar25)) +
                             (dVar25 - (local_258.hi - (local_258.hi - dVar25)));
              local_1e8 = local_208.lo;
              local_218 = local_1d8.lo;
              uStack_210 = 0;
              local_e8 = local_1d8.hi;
              local_d8 = local_208.hi;
              uStack_d0 = 0;
              local_120 = local_1d8.hi - local_208.hi;
              HVar34 = HighsCDouble::operator*(&local_258,local_120);
              local_1c8 = HVar34.lo;
              local_1b8._8_4_ = extraout_XMM0_Dc_04;
              local_1b8._0_8_ = HVar34.hi;
              local_1b8._12_4_ = extraout_XMM0_Dd_04;
              local_128 = local_258.hi;
              local_108 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar18].hi;
              uStack_100 = 0;
              local_f8 = local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar18].lo;
              HVar34 = HighsCDouble::operator*(&local_208,(double)local_248._0_8_);
              dVar29 = ((local_218 +
                        (local_e8 - (local_120 - (local_120 - local_e8))) +
                        (-local_d8 - (local_120 - local_e8))) - local_1e8) * local_128;
              dVar31 = (double)local_1b8._0_8_ + dVar29;
              dVar32 = (double)local_228._0_8_ + dVar31;
              dVar30 = dVar32 - local_108;
              dVar25 = dVar30 - HVar34.hi;
              dVar25 = ((((dVar25 - dVar30) - dVar25) + dVar30 + (-HVar34.hi - (dVar25 - dVar30)) +
                        ((((dVar30 - dVar32) - dVar30) + dVar32 + (-local_108 - (dVar30 - dVar32)) +
                         (dVar31 - (dVar32 - (dVar32 - dVar31))) +
                         ((double)local_228._0_8_ - (dVar32 - dVar31)) +
                         local_1c8 +
                         (dVar29 - (dVar31 - (dVar31 - dVar29))) +
                         ((double)local_1b8._0_8_ - (dVar31 - dVar29))) - local_f8)) - HVar34.lo) +
                       dVar25;
              pHVar20 = local_1f0;
            }
LAB_00282f13:
            pHVar20->vals[local_b0] = dVar25;
            uVar16 = local_b0;
          }
          else {
            local_228._8_8_ = 0x8000000000000000;
            local_228._0_8_ = -dVar25;
            lVar12 = (long)(-dVar25 / (local_1d8.hi + local_1d8.lo));
            if (-2 < lVar12) {
              lVar12 = -1;
            }
            if (local_a8 <= lVar12) {
              do {
                local_248._0_8_ = (double)lVar12;
                HVar34 = HighsCDouble::operator*(&local_1d8,(double)lVar12);
                dVar25 = HVar34.hi;
                dVar31 = dVar25 + local_208.hi;
                if (HVar34.lo +
                    (local_208.hi - (dVar31 - dVar25)) + (dVar25 - (dVar31 - (dVar31 - dVar25))) +
                    local_208.lo + dVar31 <= (double)local_228._0_8_) {
                  HVar34 = HighsCDouble::operator*(&local_208,(double)(lVar12 + 1));
                  dVar25 = HVar34.hi;
                  dVar31 = (double)local_228._0_8_ - dVar25;
                  dVar31 = ((((double)local_228._0_8_ - (dVar25 + dVar31)) +
                            (-dVar25 - (dVar31 - (dVar25 + dVar31)))) - HVar34.lo) + dVar31;
                  goto LAB_00282d4c;
                }
                HVar34 = HighsCDouble::operator*(&local_1d8,(double)local_248._0_8_);
                if (HVar34.hi + HVar34.lo <= (double)local_228._0_8_) {
                  local_258.hi = local_1d8.hi - local_208.hi;
                  local_258.lo = ((-local_208.hi - (local_258.hi - local_1d8.hi)) +
                                  (local_1d8.hi - (local_258.hi - (local_258.hi - local_1d8.hi))) +
                                 local_1d8.lo) - local_208.lo;
                  HVar34 = HighsCDouble::operator*(&local_258,(double)local_248._0_8_);
                  dVar31 = HVar34.lo;
                  uVar23 = HVar34.hi._0_4_;
                  uVar24 = HVar34.hi._4_4_;
                  goto LAB_00282d44;
                }
                bVar22 = lVar18 < lVar12;
                lVar12 = lVar12 + -1;
              } while (bVar22);
            }
            local_258.hi = local_1d8.hi - local_208.hi;
            local_258.lo = ((-local_208.hi - (local_258.hi - local_1d8.hi)) +
                            (local_1d8.hi - (local_258.hi - (local_258.hi - local_1d8.hi))) +
                           local_1d8.lo) - local_208.lo;
            HVar34 = HighsCDouble::operator*(&local_258,local_b8);
            dVar31 = HVar34.lo;
            uVar23 = HVar34.hi._0_4_;
            uVar24 = HVar34.hi._4_4_;
LAB_00282d44:
            dVar31 = (double)CONCAT44(uVar24,uVar23) + dVar31;
LAB_00282d4c:
            local_1f0->vals[uVar16] = -dVar31;
            dVar31 = (local_1f0->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16] * -dVar31;
            dVar25 = (local_1f0->rhs).hi;
            dVar30 = dVar25 + dVar31;
            (local_1f0->rhs).hi = dVar30;
            (local_1f0->rhs).lo =
                 (dVar25 - (dVar30 - dVar31)) + (dVar31 - (dVar30 - (dVar30 - dVar31))) +
                 (local_1f0->rhs).lo;
            pHVar20 = local_1f0;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uint)pHVar20->rowlen);
    }
    uVar6 = (uint)local_160;
  }
  if (local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar6 != 0xffffffff;
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedIntegerCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();

  HighsInt l = -1;

  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);
  for (HighsInt i : cover) coverflag[i] = 1;

  auto comp = [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; };
  pdqsort_branchless(cover.begin(), cover.end(), comp);

  std::vector<HighsCDouble> a;
  std::vector<HighsCDouble> u;
  std::vector<HighsCDouble> m;

  a.resize(coversize);
  u.resize(coversize + 1);
  m.resize(coversize + 1);

  HighsCDouble usum = 0.0;
  HighsCDouble msum = 0.0;
  // set up the partial sums of the upper bounds, and the contributions
  for (HighsInt c = 0; c != coversize; ++c) {
    HighsInt i = cover[c];

    u[c] = usum;
    m[c] = msum;
    a[c] = vals[i];
    double ub = upper[i];
    usum += ub;
    msum += ub * a[c];
  }

  u[coversize] = usum;
  m[coversize] = msum;

  // determine which variable in the cover we want to create the MIR inequality
  // from which we lift we try to select a variable to have the highest chance
  // of satisfying the facet conditions for the superadditive lifting function
  // gamma to be satisfied.
  HighsInt lpos = -1;
  HighsInt bestlCplusend = -1;
  double bestlVal = 0.0;
  bool bestlAtUpper = true;

  for (HighsInt i = 0; i != coversize; ++i) {
    HighsInt j = cover[i];
    double ub = upper[j];

    bool atUpper = solval[j] >= ub - feastol;
    if (atUpper && !bestlAtUpper) continue;

    double mju = ub * vals[j];
    HighsCDouble mu = mju - lambda;

    if (mu <= 10 * feastol) continue;
    if (std::abs(vals[j]) < 1000 * feastol) continue;

    double mudival = double(mu / vals[j]);
    if (HighsIntegers::isIntegral(mudival, feastol)) continue;
    double eta = ceil(mudival);

    HighsCDouble ulminusetaplusone = HighsCDouble(ub) - eta + 1.0;
    HighsCDouble cplusthreshold = ulminusetaplusone * vals[j];

    HighsInt cplusend =
        std::upper_bound(cover.begin(), cover.end(), double(cplusthreshold),
                         [&](double cplusthreshold, HighsInt i) {
                           return cplusthreshold > vals[i];
                         }) -
        cover.begin();

    HighsCDouble mcplus = m[cplusend];
    if (i < cplusend) mcplus -= mju;

    double jlVal = double(mcplus + eta * vals[j]);

    if (jlVal > bestlVal || (!atUpper && bestlAtUpper)) {
      lpos = i;
      bestlCplusend = cplusend;
      bestlVal = jlVal;
      bestlAtUpper = atUpper;
    }
  }

  if (lpos == -1) return false;

  l = cover[lpos];
  HighsCDouble al = vals[l];
  double upperl = upper[l];
  HighsCDouble mlu = upperl * al;
  HighsCDouble mu = mlu - lambda;

  a.resize(bestlCplusend);
  cover.resize(bestlCplusend);
  u.resize(bestlCplusend + 1);
  m.resize(bestlCplusend + 1);

  if (lpos < bestlCplusend) {
    a.erase(a.begin() + lpos);
    cover.erase(cover.begin() + lpos);
    u.erase(u.begin() + lpos + 1);
    m.erase(m.begin() + lpos + 1);
    for (HighsInt i = lpos + 1; i < bestlCplusend; ++i) {
      u[i] -= upperl;
      m[i] -= mlu;
    }
  }

  HighsInt cplussize = a.size();

  assert(mu > 10 * feastol);

  double mudival = double(mu / al);
  double eta = ceil(mudival);
  HighsCDouble r = mu - floor(mudival) * HighsCDouble(al);
  // we multiply with r and it is important that it does not flip the sign
  // so we safe guard against tiny numerical errors here
  if (r < 0) r = 0;

  HighsCDouble ulminusetaplusone = HighsCDouble(upperl) - eta + 1.0;
  HighsCDouble cplusthreshold = ulminusetaplusone * al;

  HighsInt kmin = floor(eta - upperl - 0.5);

  auto phi_l = [&](double a) {
    assert(a < 0);

    int64_t k = std::min(int64_t(a / double(al)), int64_t(-1));

    for (; k >= kmin; --k) {
      if (a >= k * al + r) {
        assert(a < (k + 1) * al);
        return double(a - (k + 1) * r);
      }

      if (a >= k * al) {
        assert(a < k * al + r);
        return double(k * (al - r));
      }
    }

    assert(a <= -lambda + epsilon);
    return double(kmin * (al - r));
  };

  int64_t kmax = floor(upperl - eta + 0.5);

  auto gamma_l = [&](double z) {
    assert(z > 0);
    for (HighsInt i = 0; i < cplussize; ++i) {
      HighsInt upperi = upper[cover[i]];

      for (HighsInt h = 0; h <= upperi; ++h) {
        HighsCDouble mih = m[i] + h * a[i];
        HighsCDouble uih = u[i] + h;
        HighsCDouble mihplusdeltai = mih + a[i] - cplusthreshold;
        if (z <= mihplusdeltai) {
          assert(mih <= z + epsilon);
          return double(uih * ulminusetaplusone * (al - r));
        }

        int64_t k = ((int64_t)(double)((z - mihplusdeltai) / al)) - 1;
        for (; k <= kmax; ++k) {
          if (z <= mihplusdeltai + k * al + r) {
            assert(mihplusdeltai + k * al <= z);
            return double((uih * ulminusetaplusone + k) * (al - r));
          }

          if (z <= mihplusdeltai + (k + 1) * al) {
            assert(mihplusdeltai + k * al + r <= z);
            return double((uih * ulminusetaplusone) * (al - r) + z - mih -
                          a[i] + cplusthreshold - (k + 1) * r);
          }
        }
      }
    }

    int64_t p = ((int64_t)(double)((z - m[cplussize]) / al)) - 1;
    for (;; ++p) {
      if (z <= m[cplussize] + p * al + r) {
        assert(m[cplussize] + p * al <= z);
        return double((u[cplussize] * ulminusetaplusone + p) * (al - r));
      }

      if (z <= m[cplussize] + (p + 1) * al) {
        assert(m[cplussize] + p * al + r <= z);
        return double((u[cplussize] * ulminusetaplusone) * (al - r) + z -
                      m[cplussize] - (p + 1) * r);
      }
    }
  };

  rhs = (HighsCDouble(upperl) - eta) * r - lambda;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (vals[i] == 0.0) continue;
    if (!isintegral[i]) {
      if (vals[i] < 0.0)
        integralSupport = false;
      else
        vals[i] = 0.0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = -phi_l(-vals[i]);
      rhs += vals[i] * upper[i];
    } else {
      vals[i] = gamma_l(vals[i]);
    }
  }

  return true;
}